

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O3

uchar * mcmhalo(mcmcx1def *ctx)

{
  mcmhdef *pmVar1;
  errdef fr_;
  errdef local_148;
  
  if (ctx->mcmcxmax < 0x8000) {
    return (uchar *)0x0;
  }
  local_148.errcode = _setjmp((__jmp_buf_tag *)local_148.errbuf);
  if (local_148.errcode == 0) {
    local_148.errprv = ctx->mcmcxerr->errcxptr;
    ctx->mcmcxerr->errcxptr = &local_148;
    pmVar1 = (mcmhdef *)mchalo(ctx->mcmcxerr,0x8018,"mcmhalo");
    ctx->mcmcxerr->errcxptr = local_148.errprv;
    ctx->mcmcxmax = ctx->mcmcxmax - 0x8000;
    pmVar1->mcmhnxt = ctx->mcmcxhpch;
    ctx->mcmcxhpch = pmVar1;
    *(undefined2 *)&pmVar1[0x1001].mcmhnxt = 0xffff;
    pmVar1 = pmVar1 + 1;
  }
  else {
    ctx->mcmcxerr->errcxptr = local_148.errprv;
    ctx->mcmcxmax = 0;
    pmVar1 = (mcmhdef *)0x0;
  }
  return (uchar *)pmVar1;
}

Assistant:

static uchar *mcmhalo(mcmcx1def *ctx)
{
    uchar  *chunk;
    int     err;
#   define  size (MCMCHUNK + sizeof(mcmhdef) + 2*osrndsz(sizeof(mcmon)))

    VARUSED(err);

    MCMGLBCTX(ctx);

    if (ctx->mcmcxmax < MCMCHUNK) return((uchar *)0);

    ERRBEGIN(ctx->mcmcxerr)
        chunk = mchalo(ctx->mcmcxerr, size, "mcmhalo");
    ERRCATCH(ctx->mcmcxerr, err)
        ctx->mcmcxmax = 0;      /* remember we can't allocate anything more */
        return((uchar *)0);                             /* return no memory */
    ERREND(ctx->mcmcxerr)

    ctx->mcmcxmax -= MCMCHUNK;
    
    /* link into heap chain */
    ((mcmhdef *)chunk)->mcmhnxt = ctx->mcmcxhpch;
    ctx->mcmcxhpch = (mcmhdef *)chunk;
/*@@@@*/
    *(mcmon *)(chunk + osrndsz(sizeof(mcmhdef) + MCMCHUNK)) = MCMONINV;
    return(chunk + sizeof(mcmhdef));

#   undef size
}